

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O0

void pztopology::TPZPrism::TShape<double>
               (TPZVec<double> *loc,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  TPZVec<double> *in_RDI;
  double col;
  double row;
  TPZFMatrix<double> *this;
  double zeta;
  double eta;
  double qsi;
  int64_t in_stack_ffffffffffffff40;
  int64_t in_stack_ffffffffffffff48;
  TPZFMatrix<double> *in_stack_ffffffffffffff50;
  
  pdVar4 = TPZVec<double>::operator[](in_RDI,0);
  dVar1 = *pdVar4;
  pdVar4 = TPZVec<double>::operator[](in_RDI,1);
  dVar2 = *pdVar4;
  pdVar4 = TPZVec<double>::operator[](in_RDI,2);
  dVar3 = *pdVar4;
  pdVar4 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40)
  ;
  *pdVar4 = ((1.0 - dVar1) - dVar2) * 0.5 * (1.0 - dVar3);
  pdVar4 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40)
  ;
  *pdVar4 = dVar1 * 0.5 * (1.0 - dVar3);
  col = dVar2 * 0.5 * (1.0 - dVar3);
  pdVar4 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(int64_t)col);
  *pdVar4 = col;
  row = ((1.0 - dVar1) - dVar2) * 0.5 * (dVar3 + 1.0);
  pdVar4 = TPZFMatrix<double>::operator()(in_stack_ffffffffffffff50,(int64_t)row,(int64_t)col);
  *pdVar4 = row;
  this = (TPZFMatrix<double> *)(dVar1 * 0.5 * (dVar3 + 1.0));
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = (double)this;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar2 * 0.5 * (dVar3 + 1.0);
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = (1.0 - dVar3) * -0.5;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = (1.0 - dVar3) * -0.5;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = ((1.0 - dVar1) - dVar2) * -0.5;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = (1.0 - dVar3) * 0.5;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = 0.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar1 * -0.5;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = 0.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = (1.0 - dVar3) * 0.5;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar2 * -0.5;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = (dVar3 + 1.0) * -0.5;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = (dVar3 + 1.0) * -0.5;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = ((1.0 - dVar1) - dVar2) * 0.5;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = (dVar3 + 1.0) * 0.5;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = 0.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar1 * 0.5;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = 0.0;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = (dVar3 + 1.0) * 0.5;
  pdVar4 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)col);
  *pdVar4 = dVar2 * 0.5;
  return;
}

Assistant:

inline void TPZPrism::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T qsi = loc[0], eta = loc[1] , zeta  = loc[2];

        phi(0,0)  = .5*(1.-qsi-eta)*(1.-zeta);
        phi(1,0)  = .5*qsi*(1.-zeta);
        phi(2,0)  = .5*eta*(1.-zeta);
        phi(3,0)  = .5*(1.-qsi-eta)*(1.+zeta);
        phi(4,0)  = .5*qsi*(1.+zeta);
        phi(5,0)  = .5*eta*(1.+zeta);

        dphi(0,0) = -.5*(1.-zeta);
        dphi(1,0) = -.5*(1.-zeta);
        dphi(2,0) = -.5*(1.-qsi-eta);
        dphi(0,1) =  .5*(1.-zeta);
        dphi(1,1) =  .0;
        dphi(2,1) = -.5*qsi;
        dphi(0,2) =  .0;
        dphi(1,2) =  .5*(1.-zeta);
        dphi(2,2) = -.5*eta;
        dphi(0,3) = -.5*(1.+zeta);
        dphi(1,3) = -.5*(1.+zeta);
        dphi(2,3) =  .5*(1.-qsi-eta);
        dphi(0,4) =  .5*(1.+zeta);
        dphi(1,4) =  .0;
        dphi(2,4) =  .5*qsi;
        dphi(0,5) =  .0;
        dphi(1,5) =  .5*(1.+zeta);
        dphi(2,5) =  .5*eta;

    }